

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr2.c
# Opt level: O0

int Ssw_ManProfileConstraints(Aig_Man_t *p,int nWords,int nFrames,int fVerbose)

{
  Vec_Ptr_t *p_00;
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  abctime aVar5;
  Vec_Ptr_t *vInfo_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Aig_Obj_t *pAVar6;
  void *pvVar7;
  void *pvVar8;
  Aig_Obj_t *pObj_00;
  void *pvVar9;
  void *pvVar10;
  void *pvVar11;
  abctime aVar12;
  abctime clk;
  int RetValue;
  int f;
  int w;
  int i;
  uint *pInfoMask2;
  uint *pInfoMask;
  uint *pInfo1;
  uint *pInfo0;
  uint *pInfo;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObj;
  Vec_Int_t *vProbs2;
  Vec_Int_t *vProbs;
  Vec_Ptr_t *vInfo;
  int fVerbose_local;
  int nFrames_local;
  int nWords_local;
  Aig_Man_t *p_local;
  
  aVar5 = Abc_Clock();
  if (fVerbose != 0) {
    uVar1 = Aig_ManNodeNum(p);
    uVar2 = Aig_ManRegNum(p);
    printf("Simulating %d nodes and %d flops for %d frames with %d words... ",(ulong)uVar1,
           (ulong)uVar2,(ulong)(uint)nFrames,(ulong)(uint)nWords);
  }
  Aig_ManRandom(1);
  iVar3 = Aig_ManObjNumMax(p);
  vInfo_00 = Vec_PtrAllocSimInfo(iVar3 + 2,nWords);
  Vec_PtrCleanSimInfo(vInfo_00,0,nWords);
  iVar3 = Saig_ManPoNum(p);
  p_01 = Vec_IntStart(iVar3);
  iVar3 = Saig_ManPoNum(p);
  p_02 = Vec_IntStart(iVar3);
  pAVar6 = Aig_ManConst1(p);
  iVar3 = Aig_ObjId(pAVar6);
  pvVar7 = Vec_PtrEntry(vInfo_00,iVar3);
  for (RetValue = 0; RetValue < nWords; RetValue = RetValue + 1) {
    *(undefined4 *)((long)pvVar7 + (long)RetValue * 4) = 0xffffffff;
  }
  for (f = 0; iVar3 = Saig_ManRegNum(p), f < iVar3; f = f + 1) {
    p_00 = p->vCos;
    iVar3 = Saig_ManPoNum(p);
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p_00,f + iVar3);
    iVar3 = Aig_ObjId(pAVar6);
    pvVar7 = Vec_PtrEntry(vInfo_00,iVar3);
    for (RetValue = 0; RetValue < nWords; RetValue = RetValue + 1) {
      *(undefined4 *)((long)pvVar7 + (long)RetValue * 4) = 0;
    }
  }
  iVar3 = Aig_ManObjNumMax(p);
  pvVar7 = Vec_PtrEntry(vInfo_00,iVar3);
  iVar3 = Aig_ManObjNumMax(p);
  pvVar8 = Vec_PtrEntry(vInfo_00,iVar3 + 1);
  for (clk._4_4_ = 0; clk._4_4_ < nFrames; clk._4_4_ = clk._4_4_ + 1) {
    for (f = 0; iVar3 = Saig_ManPiNum(p), f < iVar3; f = f + 1) {
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,f);
      iVar3 = Aig_ObjId(pAVar6);
      pvVar11 = Vec_PtrEntry(vInfo_00,iVar3);
      for (RetValue = 0; RetValue < nWords; RetValue = RetValue + 1) {
        uVar1 = Aig_ManRandom(0);
        *(uint *)((long)pvVar11 + (long)RetValue * 4) = uVar1;
      }
    }
    for (f = 0; iVar3 = Saig_ManRegNum(p), f < iVar3; f = f + 1) {
      pAVar6 = Saig_ManLi(p,f);
      pObj_00 = Saig_ManLo(p,f);
      iVar3 = Aig_ObjId(pObj_00);
      pvVar11 = Vec_PtrEntry(vInfo_00,iVar3);
      iVar3 = Aig_ObjId(pAVar6);
      pvVar10 = Vec_PtrEntry(vInfo_00,iVar3);
      for (RetValue = 0; RetValue < nWords; RetValue = RetValue + 1) {
        *(undefined4 *)((long)pvVar11 + (long)RetValue * 4) =
             *(undefined4 *)((long)pvVar10 + (long)RetValue * 4);
      }
    }
    for (f = 0; iVar3 = Vec_PtrSize(p->vObjs), f < iVar3; f = f + 1) {
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,f);
      if ((pAVar6 != (Aig_Obj_t *)0x0) && (iVar3 = Aig_ObjIsNode(pAVar6), iVar3 != 0)) {
        iVar3 = Aig_ObjId(pAVar6);
        pvVar11 = Vec_PtrEntry(vInfo_00,iVar3);
        iVar3 = Aig_ObjFaninId0(pAVar6);
        pvVar10 = Vec_PtrEntry(vInfo_00,iVar3);
        iVar3 = Aig_ObjFaninId1(pAVar6);
        pvVar9 = Vec_PtrEntry(vInfo_00,iVar3);
        iVar3 = Aig_ObjFaninC0(pAVar6);
        if (iVar3 == 0) {
          iVar3 = Aig_ObjFaninC1(pAVar6);
          if (iVar3 == 0) {
            for (RetValue = 0; RetValue < nWords; RetValue = RetValue + 1) {
              *(uint *)((long)pvVar11 + (long)RetValue * 4) =
                   *(uint *)((long)pvVar10 + (long)RetValue * 4) &
                   *(uint *)((long)pvVar9 + (long)RetValue * 4);
            }
          }
          else {
            for (RetValue = 0; RetValue < nWords; RetValue = RetValue + 1) {
              *(uint *)((long)pvVar11 + (long)RetValue * 4) =
                   *(uint *)((long)pvVar10 + (long)RetValue * 4) &
                   (*(uint *)((long)pvVar9 + (long)RetValue * 4) ^ 0xffffffff);
            }
          }
        }
        else {
          iVar3 = Aig_ObjFaninC1(pAVar6);
          if (iVar3 == 0) {
            for (RetValue = 0; RetValue < nWords; RetValue = RetValue + 1) {
              *(uint *)((long)pvVar11 + (long)RetValue * 4) =
                   (*(uint *)((long)pvVar10 + (long)RetValue * 4) ^ 0xffffffff) &
                   *(uint *)((long)pvVar9 + (long)RetValue * 4);
            }
          }
          else {
            for (RetValue = 0; RetValue < nWords; RetValue = RetValue + 1) {
              *(uint *)((long)pvVar11 + (long)RetValue * 4) =
                   (*(uint *)((long)pvVar10 + (long)RetValue * 4) |
                   *(uint *)((long)pvVar9 + (long)RetValue * 4)) ^ 0xffffffff;
            }
          }
        }
      }
    }
    for (RetValue = 0; RetValue < nWords; RetValue = RetValue + 1) {
      *(undefined4 *)((long)pvVar8 + (long)RetValue * 4) = 0;
      *(undefined4 *)((long)pvVar7 + (long)RetValue * 4) = 0;
    }
    for (f = 0; iVar3 = Vec_PtrSize(p->vCos), f < iVar3; f = f + 1) {
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,f);
      iVar3 = Aig_ObjId(pAVar6);
      pvVar11 = Vec_PtrEntry(vInfo_00,iVar3);
      iVar3 = Aig_ObjFaninId0(pAVar6);
      pvVar10 = Vec_PtrEntry(vInfo_00,iVar3);
      iVar3 = Saig_ManPoNum(p);
      iVar4 = Saig_ManConstrNum(p);
      if ((f < iVar3 - iVar4) || (iVar3 = Saig_ManPoNum(p), iVar3 <= f)) {
        iVar3 = Aig_ObjFaninC0(pAVar6);
        if (iVar3 == 0) {
          for (RetValue = 0; RetValue < nWords; RetValue = RetValue + 1) {
            *(undefined4 *)((long)pvVar11 + (long)RetValue * 4) =
                 *(undefined4 *)((long)pvVar10 + (long)RetValue * 4);
          }
        }
        else {
          for (RetValue = 0; RetValue < nWords; RetValue = RetValue + 1) {
            *(uint *)((long)pvVar11 + (long)RetValue * 4) =
                 *(uint *)((long)pvVar10 + (long)RetValue * 4) ^ 0xffffffff;
          }
        }
      }
      else {
        iVar3 = Aig_ObjFaninC0(pAVar6);
        if (iVar3 == 0) {
          for (RetValue = 0; RetValue < nWords; RetValue = RetValue + 1) {
            *(uint *)((long)pvVar11 + (long)RetValue * 4) =
                 *(uint *)((long)pvVar10 + (long)RetValue * 4) |
                 *(uint *)((long)pvVar11 + (long)RetValue * 4);
          }
        }
        else {
          for (RetValue = 0; RetValue < nWords; RetValue = RetValue + 1) {
            *(uint *)((long)pvVar11 + (long)RetValue * 4) =
                 *(uint *)((long)pvVar10 + (long)RetValue * 4) ^ 0xffffffff |
                 *(uint *)((long)pvVar11 + (long)RetValue * 4);
          }
        }
      }
      iVar3 = Saig_ManPoNum(p);
      iVar4 = Saig_ManConstrNum(p);
      if (f < iVar3 - iVar4) {
        for (RetValue = 0; RetValue < nWords; RetValue = RetValue + 1) {
          *(uint *)((long)pvVar7 + (long)RetValue * 4) =
               *(uint *)((long)pvVar11 + (long)RetValue * 4) |
               *(uint *)((long)pvVar7 + (long)RetValue * 4);
        }
      }
      else {
        iVar3 = Saig_ManPoNum(p);
        if (f < iVar3) {
          for (RetValue = 0; RetValue < nWords; RetValue = RetValue + 1) {
            *(uint *)((long)pvVar8 + (long)RetValue * 4) =
                 *(uint *)((long)pvVar11 + (long)RetValue * 4) |
                 *(uint *)((long)pvVar8 + (long)RetValue * 4);
          }
        }
      }
    }
    for (f = 0; iVar3 = Saig_ManPoNum(p), f < iVar3; f = f + 1) {
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,f);
      iVar3 = Aig_ObjId(pAVar6);
      pvVar11 = Vec_PtrEntry(vInfo_00,iVar3);
      for (RetValue = 0; RetValue < nWords; RetValue = RetValue + 1) {
        iVar3 = Aig_WordCountOnes(*(uint *)((long)pvVar11 + (long)RetValue * 4));
        Vec_IntAddToEntry(p_01,f,iVar3);
      }
      iVar3 = Saig_ManPoNum(p);
      iVar4 = Saig_ManConstrNum(p);
      if (f < iVar3 - iVar4) {
        RetValue = 0;
        while ((RetValue < nWords &&
               ((*(uint *)((long)pvVar11 + (long)RetValue * 4) &
                (*(uint *)((long)pvVar8 + (long)RetValue * 4) ^ 0xffffffff)) == 0))) {
          RetValue = RetValue + 1;
        }
        if (RetValue != nWords) {
          printf("Primary output %d fails on some input patterns.\n",(ulong)(uint)f);
        }
      }
      else {
        for (RetValue = 0; RetValue < nWords; RetValue = RetValue + 1) {
          iVar3 = Aig_WordCountOnes(*(uint *)((long)pvVar11 + (long)RetValue * 4) &
                                    *(uint *)((long)pvVar7 + (long)RetValue * 4));
          Vec_IntAddToEntry(p_02,f,iVar3);
        }
      }
    }
  }
  if (fVerbose != 0) {
    aVar12 = Abc_Clock();
    Abc_PrintTime(1,"T",aVar12 - aVar5);
    for (f = 0; iVar3 = Saig_ManPoNum(p), f < iVar3; f = f + 1) {
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,f);
      iVar3 = Saig_ManPoNum(p);
      iVar4 = Saig_ManConstrNum(p);
      if (f < iVar3 - iVar4) {
        printf("Primary output :  ");
      }
      else {
        iVar3 = Saig_ManPoNum(p);
        iVar4 = Saig_ManConstrNum(p);
        printf("Constraint %3d :  ",(ulong)(uint)(f - (iVar3 - iVar4)));
      }
      iVar3 = Vec_IntEntry(p_01,f);
      printf("ProbOne = %f  ",(double)((float)iVar3 / (float)(nWords * 0x20 * nFrames)));
      iVar3 = Vec_IntEntry(p_02,f);
      printf("ProbOneC = %f  ",(double)((float)iVar3 / (float)(nWords * 0x20 * nFrames)));
      uVar1 = Aig_ObjPhase(pAVar6);
      printf("AllZeroValue = %d ",(ulong)uVar1);
      printf("\n");
    }
  }
  Vec_PtrFree(vInfo_00);
  Vec_IntFree(p_01);
  Vec_IntFree(p_02);
  return 1;
}

Assistant:

int Ssw_ManProfileConstraints( Aig_Man_t * p, int nWords, int nFrames, int fVerbose )
{
    Vec_Ptr_t * vInfo;
    Vec_Int_t * vProbs, * vProbs2;
    Aig_Obj_t * pObj, * pObjLi;
    unsigned * pInfo, * pInfo0, * pInfo1, * pInfoMask, * pInfoMask2;
    int i, w, f, RetValue = 1;
    abctime clk = Abc_Clock();
    if ( fVerbose )
        printf( "Simulating %d nodes and %d flops for %d frames with %d words... ", 
            Aig_ManNodeNum(p), Aig_ManRegNum(p), nFrames, nWords );
    Aig_ManRandom( 1 );
    vInfo = Vec_PtrAllocSimInfo( Aig_ManObjNumMax(p)+2, nWords );
    Vec_PtrCleanSimInfo( vInfo, 0, nWords );
    vProbs  = Vec_IntStart( Saig_ManPoNum(p) );
    vProbs2 = Vec_IntStart( Saig_ManPoNum(p) );
    // start the constant
    pInfo = (unsigned *)Vec_PtrEntry( vInfo, Aig_ObjId(Aig_ManConst1(p)) );
    for ( w = 0; w < nWords; w++ )
        pInfo[w] = ~0;
    // start the flop inputs
    Saig_ManForEachLi( p, pObj, i )
    {
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, Aig_ObjId(pObj) );
        for ( w = 0; w < nWords; w++ )
            pInfo[w] = 0;
    }
    // get the info mask
    pInfoMask  = (unsigned *)Vec_PtrEntry( vInfo, Aig_ManObjNumMax(p) );    // PO failed
    pInfoMask2 = (unsigned *)Vec_PtrEntry( vInfo, Aig_ManObjNumMax(p)+1 );  // constr failed
    for ( f = 0; f < nFrames; f++ )
    {
        // assign primary inputs
        Saig_ManForEachPi( p, pObj, i )
        {
            pInfo = (unsigned *)Vec_PtrEntry( vInfo, Aig_ObjId(pObj) );
            for ( w = 0; w < nWords; w++ )
                pInfo[w] = Aig_ManRandom( 0 );
        }
        // move the flop values
        Saig_ManForEachLiLo( p, pObjLi, pObj, i )
        {
            pInfo  = (unsigned *)Vec_PtrEntry( vInfo, Aig_ObjId(pObj) );
            pInfo0 = (unsigned *)Vec_PtrEntry( vInfo, Aig_ObjId(pObjLi) );
            for ( w = 0; w < nWords; w++ )
                pInfo[w] = pInfo0[w];
        }
        // simulate the nodes
        Aig_ManForEachNode( p, pObj, i )
        {
            pInfo  = (unsigned *)Vec_PtrEntry( vInfo, Aig_ObjId(pObj) );
            pInfo0 = (unsigned *)Vec_PtrEntry( vInfo, Aig_ObjFaninId0(pObj) );
            pInfo1 = (unsigned *)Vec_PtrEntry( vInfo, Aig_ObjFaninId1(pObj) );
            if ( Aig_ObjFaninC0(pObj) )
            {
                if (  Aig_ObjFaninC1(pObj) )
                    for ( w = 0; w < nWords; w++ )
                        pInfo[w] = ~(pInfo0[w] | pInfo1[w]);
                else 
                    for ( w = 0; w < nWords; w++ )
                        pInfo[w] = ~pInfo0[w] & pInfo1[w];
            }
            else 
            {
                if (  Aig_ObjFaninC1(pObj) )
                    for ( w = 0; w < nWords; w++ )
                        pInfo[w] = pInfo0[w] & ~pInfo1[w];
                else 
                    for ( w = 0; w < nWords; w++ )
                        pInfo[w] = pInfo0[w] & pInfo1[w];
            }
        }
        // clean the mask
        for ( w = 0; w < nWords; w++ )
            pInfoMask[w] = pInfoMask2[w] = 0;
        // simulate the primary outputs
        Aig_ManForEachCo( p, pObj, i )
        {
            pInfo  = (unsigned *)Vec_PtrEntry( vInfo, Aig_ObjId(pObj) );
            pInfo0 = (unsigned *)Vec_PtrEntry( vInfo, Aig_ObjFaninId0(pObj) );
            if ( i < Saig_ManPoNum(p)-Saig_ManConstrNum(p) || i >= Saig_ManPoNum(p) )
            {
                if ( Aig_ObjFaninC0(pObj) )
                {
                    for ( w = 0; w < nWords; w++ )
                        pInfo[w] = ~pInfo0[w];
                }
                else 
                {
                    for ( w = 0; w < nWords; w++ )
                        pInfo[w] = pInfo0[w];
                }
            }
            else
            {
                if ( Aig_ObjFaninC0(pObj) )
                {
                    for ( w = 0; w < nWords; w++ )
                        pInfo[w] |= ~pInfo0[w];
                }
                else 
                {
                    for ( w = 0; w < nWords; w++ )
                        pInfo[w] |= pInfo0[w];
                }
            }
            // collect patterns when one of the outputs fails
            if ( i < Saig_ManPoNum(p)-Saig_ManConstrNum(p) )
            {
                for ( w = 0; w < nWords; w++ )
                    pInfoMask[w] |= pInfo[w];
            }
            else if ( i < Saig_ManPoNum(p) )
            {
                for ( w = 0; w < nWords; w++ )
                    pInfoMask2[w] |= pInfo[w];
            }
        }
        // compare the PO values (mask=1 => out=0) or UNSAT(mask=1 & out=1)
        Saig_ManForEachPo( p, pObj, i )
        {
            pInfo  = (unsigned *)Vec_PtrEntry( vInfo, Aig_ObjId(pObj) );
            for ( w = 0; w < nWords; w++ )
                Vec_IntAddToEntry( vProbs, i, Aig_WordCountOnes(pInfo[w]) );
            if ( i < Saig_ManPoNum(p)-Saig_ManConstrNum(p) )
            {
                // chek the output
                for ( w = 0; w < nWords; w++ )
                    if ( pInfo[w] & ~pInfoMask2[w] ) 
                        break;
                if ( w == nWords )
                    continue;
                printf( "Primary output %d fails on some input patterns.\n", i );
            }
            else
            {
                // collect patterns that block the POs
                for ( w = 0; w < nWords; w++ )
                    Vec_IntAddToEntry( vProbs2, i, Aig_WordCountOnes(pInfo[w] & pInfoMask[w]) );
            }
        }
    }
    if ( fVerbose )
        Abc_PrintTime( 1, "T", Abc_Clock() - clk );
    // print the state
    if ( fVerbose )
    {
        Saig_ManForEachPo( p, pObj, i )
        {
            if ( i < Saig_ManPoNum(p) - Saig_ManConstrNum(p) )
                printf( "Primary output :  " );
            else
                printf( "Constraint %3d :  ", i-(Saig_ManPoNum(p) - Saig_ManConstrNum(p))  );
            printf( "ProbOne = %f  ",  (float)Vec_IntEntry(vProbs,  i)/(32*nWords*nFrames) );
            printf( "ProbOneC = %f  ", (float)Vec_IntEntry(vProbs2, i)/(32*nWords*nFrames) );
            printf( "AllZeroValue = %d ", Aig_ObjPhase(pObj) );
            printf( "\n" );
        }
    }

    // print the states
    Vec_PtrFree( vInfo );
    Vec_IntFree( vProbs );
    Vec_IntFree( vProbs2 );
    return RetValue;
}